

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O0

void __thiscall OSTEI_HRR_Writer::WriteHRR_Bra_General_(OSTEI_HRR_Writer *this,ostream *os,QAM *am)

{
  bool bVar1;
  RRStepType RVar2;
  ostream *poVar3;
  int *piVar4;
  QAM *am_00;
  ostream *in_RSI;
  QAM *it;
  iterator __end1;
  iterator __begin1;
  QAMList *__range1;
  RRStepType rrstep;
  RRStepType in_stack_0000023c;
  QAM *in_stack_00000240;
  OSTEI_HRR_Algorithm_Base *in_stack_00000248;
  undefined4 in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  QAM *in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdd8;
  string *psVar5;
  DAM *in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffe18;
  RRStepType step;
  DAM *in_stack_fffffffffffffe28;
  OSTEI_HRR_Algorithm_Base *in_stack_fffffffffffffe30;
  string local_148 [32];
  string local_128 [32];
  reference local_108;
  QAM *local_100;
  __normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> local_f8 [7];
  undefined1 local_c0 [24];
  undefined1 *local_a8;
  string local_a0 [55];
  allocator local_69;
  string local_68 [76];
  RRStepType local_1c;
  ostream *local_10;
  
  step = (RRStepType)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  local_10 = in_RSI;
  QAM::operator[](in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
  QAM::operator[](in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"",&local_69);
  DAM::DAM(in_stack_fffffffffffffde0,(int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
           (int)in_stack_fffffffffffffdd8,(string *)in_stack_fffffffffffffdd0);
  RVar2 = OSTEI_HRR_Algorithm_Base::GetBraRRStep
                    (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  DAM::~DAM((DAM *)0x14dbe4);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_1c = RVar2;
  poVar3 = std::operator<<(local_10,(string *)indent4_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"ostei_general_hrr_");
  RRStepTypeToStr_abi_cxx11_(step);
  poVar3 = std::operator<<(poVar3,local_a0);
  poVar3 = std::operator<<(poVar3,"(");
  piVar4 = QAM::operator[](in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar4);
  poVar3 = std::operator<<(poVar3,", ");
  piVar4 = QAM::operator[](in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar4);
  poVar3 = std::operator<<(poVar3,", ");
  piVar4 = QAM::operator[](in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar4);
  am_00 = (QAM *)std::operator<<(poVar3,", ");
  piVar4 = QAM::operator[](in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
  poVar3 = (ostream *)std::ostream::operator<<(am_00,*piVar4);
  std::operator<<(poVar3,", hAB, ");
  std::__cxx11::string::~string(local_a0);
  QAM::QAM(in_stack_fffffffffffffdd0,
           (QAM *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  OSTEI_HRR_Algorithm_Base::GenerateAMReq(in_stack_00000248,in_stack_00000240,in_stack_0000023c);
  QAM::~QAM((QAM *)0x14de26);
  local_a8 = local_c0;
  local_f8[0]._M_current =
       (QAM *)std::vector<QAM,_std::allocator<QAM>_>::begin
                        ((vector<QAM,_std::allocator<QAM>_> *)
                         CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  local_100 = (QAM *)std::vector<QAM,_std::allocator<QAM>_>::end
                               ((vector<QAM,_std::allocator<QAM>_> *)
                                CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> *)
                       in_stack_fffffffffffffdd0,
                       (__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> *)
                       CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    if (!bVar1) break;
    local_108 = __gnu_cxx::__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_>::
                operator*(local_f8);
    poVar3 = local_10;
    HRRVarName_abi_cxx11_(am_00);
    poVar3 = std::operator<<(poVar3,local_128);
    std::operator<<(poVar3,", ");
    std::__cxx11::string::~string(local_128);
    __gnu_cxx::__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_>::operator++
              (local_f8);
  }
  std::vector<QAM,_std::allocator<QAM>_>::~vector
            ((vector<QAM,_std::allocator<QAM>_> *)in_stack_fffffffffffffde0);
  psVar5 = local_148;
  HRRVarName_abi_cxx11_(am_00);
  poVar3 = std::operator<<(local_10,psVar5);
  std::operator<<(poVar3,");\n");
  std::__cxx11::string::~string(local_148);
  return;
}

Assistant:

void OSTEI_HRR_Writer::WriteHRR_Bra_General_(std::ostream & os, QAM am) const
{
    // call function
    RRStepType rrstep = hrr_algo_.GetBraRRStep({am[0], am[1]});
    os << indent4 << "ostei_general_hrr_" << RRStepTypeToStr(rrstep)
       << "(" << am[0] << ", " << am[1] << ", " << am[2] << ", " << am[3] << ", hAB, ";

    for(const auto & it : hrr_algo_.GenerateAMReq(am, rrstep))
        os << HRRVarName(it) << ", ";

    os << HRRVarName(am) << ");\n";
}